

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O2

int h264_macroblock_layer
              (bitstream *str,h264_cabac_context *cabac,h264_slice *slice,h264_macroblock *mb)

{
  uint mb_type;
  h264_seqparm *phVar1;
  h264_picparm *phVar2;
  int iVar3;
  ulong uVar4;
  uint32_t ival;
  bool bVar5;
  uint32_t *puVar6;
  long lVar7;
  
  phVar1 = slice->seqparm;
  phVar2 = slice->picparm;
  puVar6 = &mb->mb_type;
  iVar3 = h264_mb_type(str,cabac,slice->slice_type,puVar6);
  if (iVar3 != 0) {
    return 1;
  }
  uVar4 = (ulong)*puVar6;
  if (uVar4 < 0x38) {
    if ((0x800000c0000000U >> (uVar4 & 0x3f) & 1) == 0) {
      if ((0x4000001UL >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 == 0x19) {
          iVar3 = vs_align_byte(str,VS_ALIGN_0);
          if (iVar3 != 0) {
            return 1;
          }
          lVar7 = 0x14;
          while (lVar7 + 4 != 0x418) {
            iVar3 = vs_u(str,(uint32_t *)((long)mb->pcm_sample_luma + lVar7 + -0x14),
                         slice->bit_depth_luma_minus8 + 8);
            lVar7 = lVar7 + 4;
            if (iVar3 != 0) {
              return 1;
            }
          }
          if (slice->chroma_array_type != 0) {
            lVar7 = -1;
            puVar6 = mb->pcm_sample_chroma;
            while (lVar7 = lVar7 + 1, lVar7 < 0x40 << ((byte)slice->chroma_array_type & 0x1f)) {
              iVar3 = vs_u(str,puVar6,slice->bit_depth_chroma_minus8 + 8);
              puVar6 = puVar6 + 1;
              if (iVar3 != 0) {
                return 1;
              }
            }
          }
          if ((cabac != (h264_cabac_context *)0x0) &&
             (iVar3 = h264_cabac_init_arith(str,cabac), iVar3 != 0)) {
            return 1;
          }
          iVar3 = vs_infers(str,&mb->mb_qp_delta,0);
          if (iVar3 != 0) {
            return 1;
          }
          iVar3 = vs_infer(str,&mb->transform_size_8x8_flag,0);
          if (iVar3 != 0) {
            return 1;
          }
          iVar3 = vs_infer(str,&mb->coded_block_pattern,0x2f);
          if (iVar3 != 0) {
            return 1;
          }
          iVar3 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
          if (iVar3 == 0) {
            iVar3 = infer_intra(str,mb,0);
            if (iVar3 != 0) {
              return 1;
            }
            iVar3 = infer_intra(str,mb,1);
            if (iVar3 == 0) {
              for (lVar7 = -0x44; lVar7 != 0; lVar7 = lVar7 + 4) {
                *(undefined4 *)((long)mb->coded_block_flag[1] + lVar7) = 1;
                *(undefined4 *)((long)mb->coded_block_flag[2] + lVar7) = 1;
                *(undefined4 *)((long)mb[1].pcm_sample_luma + lVar7 + -0x14) = 1;
              }
              for (lVar7 = -0x40; lVar7 != 0; lVar7 = lVar7 + 4) {
                *(undefined4 *)((long)mb->total_coeff[1] + lVar7) = 0x10;
                *(undefined4 *)((long)mb->total_coeff[2] + lVar7) = 0x10;
                *(undefined4 *)((long)mb->coded_block_flag[0] + lVar7) = 0x10;
              }
              return 0;
            }
            return 1;
          }
          return 1;
        }
      }
      else {
        if (phVar2->transform_8x8_mode_flag == 0) {
          iVar3 = vs_infer(str,&mb->transform_size_8x8_flag,0);
        }
        else {
          iVar3 = h264_transform_size_8x8_flag(str,cabac,&mb->transform_size_8x8_flag);
        }
        if (iVar3 != 0) {
          return 1;
        }
      }
      goto LAB_00104784;
    }
    iVar3 = h264_sub_mb_pred(str,cabac,slice,mb);
    if (iVar3 != 0) {
      return 1;
    }
    bVar5 = true;
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      if ((ulong)mb->sub_mb_type[lVar7] == 4) {
        if (phVar1->direct_8x8_inference_flag == 0) {
          bVar5 = false;
        }
      }
      else if (sub_mb_part_info[mb->sub_mb_type[lVar7]][0] != 0) {
        bVar5 = false;
      }
    }
    iVar3 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
    if (iVar3 != 0) {
      return 1;
    }
  }
  else {
LAB_00104784:
    iVar3 = h264_mb_pred(str,cabac,slice,mb);
    bVar5 = true;
    if (iVar3 != 0) {
      return 1;
    }
  }
  mb_type = *puVar6;
  if (((mb_type == 0) || (mb_type == 0x1a)) || (0x19 < mb_type)) {
    iVar3 = h264_coded_block_pattern
                      (str,cabac,mb_type,(uint)(slice->chroma_array_type - 1 < 2),
                       &mb->coded_block_pattern);
    if (iVar3 != 0) {
      return 1;
    }
    if (*puVar6 < 0x1a) goto LAB_001048ee;
    if ((((mb->coded_block_pattern & 0xf) == 0) || (phVar2->transform_8x8_mode_flag == 0)) ||
       ((!bVar5 || ((*puVar6 == 0x21 && (phVar1->direct_8x8_inference_flag == 0))))))
    goto LAB_001048d3;
    iVar3 = h264_transform_size_8x8_flag(str,cabac,&mb->transform_size_8x8_flag);
  }
  else {
    ival = ((mb_type - 1 >> 2) % 3) * 0x10;
    if (0xc < mb_type) {
      ival = ival + 0xf;
    }
    iVar3 = vs_infer(str,&mb->coded_block_pattern,ival);
    if (iVar3 != 0) {
      return 1;
    }
LAB_001048d3:
    iVar3 = vs_infer(str,&mb->transform_size_8x8_flag,0);
  }
  if (iVar3 != 0) {
    return 1;
  }
LAB_001048ee:
  if ((mb->coded_block_pattern == 0) && (*puVar6 - 0x19 < 0xffffffe8)) {
    iVar3 = vs_infers(str,&mb->mb_qp_delta,0);
  }
  else {
    iVar3 = h264_mb_qp_delta(str,cabac,&mb->mb_qp_delta);
  }
  if (iVar3 == 0) {
    iVar3 = h264_residual(str,cabac,slice,mb,0,0xf);
    if (iVar3 == 0) {
      return 0;
    }
    return 1;
  }
  return 1;
}

Assistant:

int h264_macroblock_layer(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb) {
	struct h264_picparm *picparm = slice->picparm;
	struct h264_seqparm *seqparm = slice->seqparm;
	if (h264_mb_type(str, cabac, slice->slice_type, &mb->mb_type)) return 1;
	if (mb->mb_type == H264_MB_TYPE_I_PCM) {
		if (vs_align_byte(str, VS_ALIGN_0)) return 1;
		int i;
		for (i = 0; i < 256; i++)
			if (vs_u(str, &mb->pcm_sample_luma[i], slice->bit_depth_luma_minus8 + 8)) return 1;
		if (slice->chroma_array_type) {
			for (i = 0; i < (64 << slice->chroma_array_type); i++)
				if (vs_u(str, &mb->pcm_sample_chroma[i], slice->bit_depth_chroma_minus8 + 8)) return 1;
		}
		if (cabac)
			if (h264_cabac_init_arith(str, cabac)) return 1;
		if (vs_infers(str, &mb->mb_qp_delta, 0)) return 1;
		if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
		if (vs_infer(str, &mb->coded_block_pattern, 0x2f)) return 1;
		if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		if (infer_intra(str, mb, 0)) return 1;
		if (infer_intra(str, mb, 1)) return 1;
		for (i = 0; i < 17; i++) {
			mb->coded_block_flag[0][i] = 1;
			mb->coded_block_flag[1][i] = 1;
			mb->coded_block_flag[2][i] = 1;
		}
		for (i = 0; i < 16; i++) {
			mb->total_coeff[0][i] = 16;
			mb->total_coeff[1][i] = 16;
			mb->total_coeff[2][i] = 16;
		}
	} else {
		int noSubMbPartSizeLessThan8x8Flag = 1;
		if (h264_is_submb_mb_type(mb->mb_type)) {
			if (h264_sub_mb_pred(str, cabac, slice, mb)) return 1;
			int i;
			for (i = 0; i < 4; i++) {
				if (mb->sub_mb_type[i] != H264_SUB_MB_TYPE_B_DIRECT_8X8) {
					if (sub_mb_part_info[mb->sub_mb_type[i]][0])
						noSubMbPartSizeLessThan8x8Flag = 0;
				} else {
					if (!seqparm->direct_8x8_inference_flag)
						noSubMbPartSizeLessThan8x8Flag = 0;
				}
			}
			if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		} else {
			if (mb->mb_type == H264_MB_TYPE_I_NXN || mb->mb_type == H264_MB_TYPE_SI) {
				if (picparm->transform_8x8_mode_flag) {
					if (h264_transform_size_8x8_flag(str, cabac, &mb->transform_size_8x8_flag)) return 1;
				} else {
					if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
				}
			}
			if (h264_mb_pred(str, cabac, slice, mb)) return 1;
		}
		if (mb->mb_type == H264_MB_TYPE_I_NXN || mb->mb_type == H264_MB_TYPE_SI || mb->mb_type >= H264_MB_TYPE_I_END) {
			int has_chroma = slice->chroma_array_type < 3 && slice->chroma_array_type != 0;
			if (h264_coded_block_pattern(str, cabac, mb->mb_type, has_chroma, &mb->coded_block_pattern)) return 1;
			if (mb->mb_type >= H264_MB_TYPE_I_END) {
				if ((mb->coded_block_pattern & 0xf) && picparm->transform_8x8_mode_flag && noSubMbPartSizeLessThan8x8Flag && (mb->mb_type != H264_MB_TYPE_B_DIRECT_16X16 || seqparm->direct_8x8_inference_flag)) {
					if (h264_transform_size_8x8_flag(str, cabac, &mb->transform_size_8x8_flag)) return 1;
				} else {
					if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
				}
			}
		} else {
			int infer_cbp = (((mb->mb_type - H264_MB_TYPE_I_16X16_0_0_0) >> 2) % 3) << 4;
			if (mb->mb_type >= H264_MB_TYPE_I_16X16_0_0_1)
				infer_cbp |= 0xf;
			if (vs_infer(str, &mb->coded_block_pattern, infer_cbp)) return 1;
			if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
		}
		if (mb->coded_block_pattern || h264_is_intra_16x16_mb_type(mb->mb_type)) {
			if (h264_mb_qp_delta(str, cabac, &mb->mb_qp_delta)) return 1;
		} else {
			if (vs_infers(str, &mb->mb_qp_delta, 0)) return 1;
		}
		if (h264_residual(str, cabac, slice, mb, 0, 15)) return 1;
	}
	return 0;
}